

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferQueue::Write(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  element_type *peVar1;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  uint32_t uVar6;
  bool bVar7;
  shared_ptr<cppnet::BufferBlock> from_buffer;
  shared_ptr<cppnet::BufferQueue> buffer_queue;
  List<cppnet::BufferBlock> from_list;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_c0;
  BufferQueue *local_b0;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *local_a8;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<cppnet::InnerBuffer> local_90;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *local_80;
  __shared_ptr<cppnet::InnerBuffer,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  List<cppnet::BufferBlock> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar1 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = 0;
  if (peVar1 != (element_type *)0x0) {
    local_b0 = this;
    if ((len == 0) && (len = (*(peVar1->super_Buffer)._vptr_Buffer[8])(), len == 0)) {
      return 0;
    }
    std::dynamic_pointer_cast<cppnet::BufferQueue,cppnet::InnerBuffer>(&local_90);
    List<cppnet::BufferBlock>::List
              (&local_68,
               (List<cppnet::BufferBlock> *)
               (local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + 2));
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               &local_68._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               &local_68._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    uVar3 = (*((local_c0._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    local_a8 = &(local_b0->_buffer_write).
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
    local_80 = &(local_b0->_buffer_list)._tail.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
    uVar6 = 0;
    do {
      peVar5 = ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)&local_a8->_M_ptr)
               ->_M_ptr;
      if (peVar5 == (element_type *)0x0) {
        (*(local_b0->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,local_80);
        p_Var2 = local_a8;
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_a8,&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        peVar5 = p_Var2->_M_ptr;
      }
      std::__shared_ptr<cppnet::InnerBuffer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppnet::BufferBlock,void>(local_78,&local_a0);
      uVar4 = (*(peVar5->super_InnerBuffer).super_Buffer._vptr_Buffer[0xd])
                        (peVar5,local_78,(ulong)uVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
      p_Var2 = local_a8;
      uVar6 = uVar6 + uVar4;
      bVar7 = uVar3 < uVar4;
      uVar3 = uVar3 - uVar4;
      if (bVar7 || uVar3 == 0) {
        peVar5 = (element_type *)
                 local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 [7].super_Buffer._vptr_Buffer;
        if (local_a0._M_ptr == peVar5) {
          std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c0,
                     &(peVar5->super_ListSlot<cppnet::BufferBlock>)._next.
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
          peVar5 = local_c0._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
          if (peVar5 == (element_type *)0x0) {
            (*((local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_Buffer)._vptr_Buffer[0x12])();
            break;
          }
          std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c0,
                     (__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[7].super_Buffer._vptr_Buffer + 4));
          std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 7),&local_c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        }
        List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,
                   &local_68._head.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_a0,&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        uVar3 = (*((local_a0._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
      }
      else {
        if (len <= uVar6) break;
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,
                   &(local_a8->_M_ptr->super_ListSlot<cppnet::BufferBlock>)._next.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var2,&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
      }
    } while (uVar6 < len);
    local_b0->_can_read_length = local_b0->_can_read_length + uVar6;
    *(uint32_t *)
     &local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      super_Buffer._vptr_Buffer =
         *(int *)&local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr[1].super_Buffer._vptr_Buffer - uVar6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    List<cppnet::BufferBlock>::~List(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_90.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return uVar6;
}

Assistant:

uint32_t BufferQueue::Write(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = buffer->GetCanReadLength();
    }
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    auto from_list = buffer_queue->_buffer_list;
    auto from_buffer = from_list.GetHead();

    uint32_t should_write_size = from_list.GetHead()->GetCanReadLength();
    uint32_t total_write_len = 0;
    uint32_t cur_write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        cur_write_len = _buffer_write->Write(from_buffer, should_write_size);
        total_write_len += cur_write_len;
        
        // current read block is empty
        if (cur_write_len >= should_write_size) {
            if (from_buffer == buffer_queue->_buffer_write) {
                if (buffer_queue->_buffer_write->GetNext()) {
                    buffer_queue->_buffer_write = buffer_queue->_buffer_write->GetNext();

                } else {
                    buffer_queue->Reset();
                    break;
                }
            }
            from_list.PopFront();
            from_buffer = from_list.GetHead();
            should_write_size = from_buffer->GetCanReadLength();

        // current write block is full
        } else {
            if (total_write_len >= len) {
                break;
            }
            should_write_size -= cur_write_len;
            _buffer_write = _buffer_write->GetNext();
        }

        if (total_write_len >= len) {
            break;
        }
    }
    _can_read_length += total_write_len;
    buffer_queue->_can_read_length -= total_write_len;
    return total_write_len;
}